

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.hpp
# Opt level: O3

void __thiscall
duckdb::PartitionedTupleData::ComputePartitionIndices
          (PartitionedTupleData *this,PartitionedTupleDataAppendState *state,DataChunk *input,
          SelectionVector *append_sel,idx_t append_count)

{
  NotImplementedException *this_00;
  string local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"ComputePartitionIndices for this type of PartitionedTupleData","")
  ;
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

virtual void ComputePartitionIndices(PartitionedTupleDataAppendState &state, DataChunk &input,
	                                     const SelectionVector &append_sel, const idx_t append_count) {
		throw NotImplementedException("ComputePartitionIndices for this type of PartitionedTupleData");
	}